

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool GetNameProxy(Proxy *nameProxyOut)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock8;
  unique_lock<std::mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&uStack_28,&g_proxyinfo_mutex,"g_proxyinfo_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
             ,0x2c3,false);
  bVar1 = Proxy::IsValid(&nameProxy);
  if (bVar1) {
    Proxy::operator=(nameProxyOut,&nameProxy);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GetNameProxy(Proxy &nameProxyOut) {
    LOCK(g_proxyinfo_mutex);
    if(!nameProxy.IsValid())
        return false;
    nameProxyOut = nameProxy;
    return true;
}